

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TreeEnsemble.cpp
# Opt level: O3

void __thiscall
CoreML::TreeEnsembleClassifier::setOutputClassList
          (TreeEnsembleClassifier *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *classes)

{
  int iVar1;
  Model *pMVar2;
  ulong uVar3;
  Rep *pRVar4;
  TreeEnsembleClassifier *pTVar5;
  StringVector *pSVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *obj;
  string *psVar7;
  ulong uVar8;
  Arena *pAVar9;
  
  pMVar2 = (this->super_TreeEnsembleBase).super_Model.m_spec.
           super___shared_ptr<CoreML::Specification::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (pMVar2->_oneof_case_[0] == 0x192) {
    pTVar5 = (pMVar2->Type_).treeensembleclassifier_;
  }
  else {
    Specification::Model::clear_Type(pMVar2);
    pMVar2->_oneof_case_[0] = 0x192;
    uVar8 = (pMVar2->super_MessageLite)._internal_metadata_.ptr_;
    pAVar9 = (Arena *)(uVar8 & 0xfffffffffffffffc);
    if ((uVar8 & 1) != 0) {
      pAVar9 = *(Arena **)pAVar9;
    }
    pTVar5 = google::protobuf::Arena::
             CreateMaybeMessage<CoreML::Specification::TreeEnsembleClassifier>(pAVar9);
    (pMVar2->Type_).treeensembleclassifier_ = pTVar5;
  }
  if (pTVar5->_oneof_case_[0] == 100) {
    pSVar6 = (pTVar5->ClassLabels_).stringclasslabels_;
  }
  else {
    Specification::TreeEnsembleClassifier::clear_ClassLabels(pTVar5);
    pTVar5->_oneof_case_[0] = 100;
    uVar8 = (pTVar5->super_MessageLite)._internal_metadata_.ptr_;
    pAVar9 = (Arena *)(uVar8 & 0xfffffffffffffffc);
    if ((uVar8 & 1) != 0) {
      pAVar9 = *(Arena **)pAVar9;
    }
    pSVar6 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::StringVector>
                       (pAVar9);
    (pTVar5->ClassLabels_).stringclasslabels_ = pSVar6;
  }
  google::protobuf::internal::RepeatedPtrFieldBase::
  Clear<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
            (&(pSVar6->vector_).super_RepeatedPtrFieldBase);
  if ((classes->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish !=
      (classes->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_start) {
    uVar8 = 0;
    do {
      pMVar2 = (this->super_TreeEnsembleBase).super_Model.m_spec.
               super___shared_ptr<CoreML::Specification::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if (pMVar2->_oneof_case_[0] == 0x192) {
        pTVar5 = (pMVar2->Type_).treeensembleclassifier_;
      }
      else {
        Specification::Model::clear_Type(pMVar2);
        pMVar2->_oneof_case_[0] = 0x192;
        uVar3 = (pMVar2->super_MessageLite)._internal_metadata_.ptr_;
        pAVar9 = (Arena *)(uVar3 & 0xfffffffffffffffc);
        if ((uVar3 & 1) != 0) {
          pAVar9 = *(Arena **)pAVar9;
        }
        pTVar5 = google::protobuf::Arena::
                 CreateMaybeMessage<CoreML::Specification::TreeEnsembleClassifier>(pAVar9);
        (pMVar2->Type_).treeensembleclassifier_ = pTVar5;
      }
      if (pTVar5->_oneof_case_[0] == 100) {
        pSVar6 = (pTVar5->ClassLabels_).stringclasslabels_;
      }
      else {
        Specification::TreeEnsembleClassifier::clear_ClassLabels(pTVar5);
        pTVar5->_oneof_case_[0] = 100;
        uVar3 = (pTVar5->super_MessageLite)._internal_metadata_.ptr_;
        pAVar9 = (Arena *)(uVar3 & 0xfffffffffffffffc);
        if ((uVar3 & 1) != 0) {
          pAVar9 = *(Arena **)pAVar9;
        }
        pSVar6 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::StringVector>
                           (pAVar9);
        (pTVar5->ClassLabels_).stringclasslabels_ = pSVar6;
      }
      pRVar4 = (pSVar6->vector_).super_RepeatedPtrFieldBase.rep_;
      if (pRVar4 == (Rep *)0x0) {
LAB_002e29f6:
        obj = google::protobuf::Arena::Create<std::__cxx11::string>
                        ((pSVar6->vector_).super_RepeatedPtrFieldBase.arena_);
        psVar7 = (string *)
                 google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                           (&(pSVar6->vector_).super_RepeatedPtrFieldBase,obj);
      }
      else {
        iVar1 = (pSVar6->vector_).super_RepeatedPtrFieldBase.current_size_;
        if (pRVar4->allocated_size <= iVar1) goto LAB_002e29f6;
        (pSVar6->vector_).super_RepeatedPtrFieldBase.current_size_ = iVar1 + 1;
        psVar7 = (string *)pRVar4->elements[iVar1];
      }
      std::__cxx11::string::_M_assign(psVar7);
      uVar8 = uVar8 + 1;
    } while (uVar8 < (ulong)((long)(classes->
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   )._M_impl.super__Vector_impl_data._M_finish -
                             (long)(classes->
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   )._M_impl.super__Vector_impl_data._M_start >> 5));
  }
  return;
}

Assistant:

void TreeEnsembleClassifier::setOutputClassList(const std::vector<std::string>& classes) {
        m_spec->mutable_treeensembleclassifier()->mutable_stringclasslabels()->clear_vector();
        for(size_t i = 0; i < classes.size(); ++i) {
            std::string *category = m_spec->mutable_treeensembleclassifier()->mutable_stringclasslabels()->add_vector();
            *category = classes[i];
        }
    }